

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O3

void mark_list(zt_gc_t *gc,value_t *value)

{
  zt_elist *pzVar1;
  zt_elist *pzVar2;
  value_t *vval;
  
  pzVar1 = value[1].mark.list.next;
  if (pzVar1 != (zt_elist *)0x0) {
    if ((pzVar1[1].next != (zt_elist *)0x0) &&
       (pzVar2 = (pzVar1[1].next)->next, pzVar2 != (zt_elist *)0x0)) {
      (*(code *)pzVar2)(gc,pzVar1);
    }
    zt_gc_mark(gc,pzVar1);
  }
  pzVar1 = value[1].mark.list.prev;
  if (pzVar1 != (zt_elist *)0x0) {
    if ((pzVar1[1].next != (zt_elist *)0x0) &&
       (pzVar2 = (pzVar1[1].next)->next, pzVar2 != (zt_elist *)0x0)) {
      (*(code *)pzVar2)(gc,pzVar1);
    }
    zt_gc_mark(gc,pzVar1);
    return;
  }
  return;
}

Assistant:

static void
mark_list(zt_gc_t * gc, value_t * value) {
    list_t  * list = (list_t *)value;

    /*  we want to mark any child "objects" that are managed
     *  by the GC
     */
    if (list->value) {
        mark_value(gc, NULL, list->value);
    }

    if (list->tail) {
        mark_value(gc, NULL, list->tail);
    }
}